

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O1

void __thiscall t_html_generator::generate_index(t_html_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  pointer *ppptVar1;
  long *plVar2;
  ostream *poVar3;
  long *plVar4;
  _Alloc_hider _Var5;
  vector<t_program_*,_std::allocator<t_program_*>_> programs;
  string index_fname;
  allocator local_69;
  vector<t_program_*,_std::allocator<t_program_*>_> local_68;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  std::__cxx11::string::_M_replace
            ((ulong)&this->current_file_,0,(char *)(this->current_file_)._M_string_length,0x38dfef);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_68,this);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_68,(ulong)(this->current_file_)._M_dataplus._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_30 = *plVar4;
    lStack_28 = plVar2[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar4;
    local_40 = (long *)*plVar2;
  }
  local_38 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ppptVar1 = &local_68.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  if (local_68.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppptVar1) {
    operator_delete(local_68.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::string::string((string *)&local_68,(char *)local_40,&local_69);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_out_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x70);
  this_00 = &this->f_out_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_out_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90 =
       0;
  if (local_68.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppptVar1) {
    operator_delete(local_68.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"<!DOCTYPE html>",0xf);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<html lang=\"en\"><head>",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  generate_style_tag(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"<title>All Thrift declarations</title></head><body>",0x33);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<div class=\"container-fluid\">",0x1d);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<h1>All Thrift declarations</h1>",0x20)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "<table class=\"table-bordered table-striped table-condensed\"><thead><tr><th>Module</th><th>Services</th><th>Data types</th>"
             ,0x7a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"<th>Constants</th></tr></thead><tbody>",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  local_68.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generate_program_toc_rows(this,(this->super_t_generator).program_,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"</tbody></table>",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"</div></body></html>",0x14)
  ;
  _Var5 = ::endl_abi_cxx11_._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,(int)_Var5._M_p);
  if (local_68.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void t_html_generator::generate_index() {
  current_file_ = "index.html";
  string index_fname = get_out_dir() + current_file_;
  f_out_.open(index_fname.c_str());
  f_out_ << "<!DOCTYPE html>" << endl << "<html lang=\"en\"><head>" << endl;
  generate_style_tag();
  f_out_ << "<title>All Thrift declarations</title></head><body>" << endl
         << "<div class=\"container-fluid\">" << endl << "<h1>All Thrift declarations</h1>" << endl;
  f_out_ << "<table class=\"table-bordered table-striped "
            "table-condensed\"><thead><tr><th>Module</th><th>Services</th><th>Data types</th>"
         << "<th>Constants</th></tr></thead><tbody>" << endl;
  vector<t_program*> programs;
  generate_program_toc_rows(program_, programs);
  f_out_ << "</tbody></table>" << endl;
  f_out_ << "</div></body></html>" << endl;
  f_out_.close();
}